

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fReadPixelsTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
          (ReadPixelsTest *this,Context *context,char *name,char *description,int flags,
          int alignment,GLint rowLength,GLint skipRows,GLint skipPixels,GLenum format,GLenum type)

{
  deUint32 dVar1;
  
  TestCase::TestCase(&this->super_TestCase,context,name,"");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c1c5d8;
  dVar1 = deStringHash(name);
  (this->m_random).m_rnd.x = dVar1;
  *(byte *)&(this->m_random).m_rnd.y = (byte)((ulong)description & 0xffffffff) & 1;
  *(byte *)((long)&(this->m_random).m_rnd.y + 1) =
       (byte)(((ulong)description & 0xffffffff) >> 1) & 1;
  (this->m_random).m_rnd.z = flags;
  (this->m_random).m_rnd.w = alignment;
  *(GLint *)&this->m_log = rowLength;
  *(GLint *)((long)&this->m_log + 4) = skipRows;
  *(GLint *)&this->m_program = skipPixels;
  *(GLenum *)((long)&this->m_program + 4) = format;
  this->m_framebuffeType = 0xd;
  this->m_renderbufferFormat = 0xd;
  return;
}

Assistant:

ReadPixelsTest::ReadPixelsTest	(Context& context, const char* name, const char* description, int flags, int alignment, GLint rowLength, GLint skipRows, GLint skipPixels, GLenum format, GLenum type)
	: TestCase			(context, name, description)
	, m_seed			(deStringHash(name))
	, m_chooseFormat	((flags & FLAG_CHOOSE_FORMAT) != 0)
	, m_useRenderBuffer	((flags & FLAG_USE_RBO) != 0)
	, m_alignment		(alignment)
	, m_rowLength		(rowLength)
	, m_skipRows		(skipRows)
	, m_skipPixels		(skipPixels)
	, m_format			(format)
	, m_type			(type)
	, m_width			(13)
	, m_height			(13)
{
}